

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

floatx80 floatx80_tentox_m68k(floatx80 a,float_status *status)

{
  char cVar1;
  int8_t roundingPrecision;
  undefined8 uVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  short sVar6;
  uint a_00;
  uint uVar7;
  uint64_t uVar8;
  int iVar9;
  int32_t zExp;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 a_06;
  floatx80 a_07;
  floatx80 a_08;
  floatx80 a_09;
  floatx80 a_10;
  floatx80 a_11;
  floatx80 a_12;
  floatx80 a_13;
  floatx80 a_14;
  floatx80 a_15;
  floatx80 a_16;
  floatx80 a_17;
  floatx80 a_18;
  floatx80 a_19;
  floatx80 a_20;
  floatx80 a_21;
  floatx80 a_22;
  floatx80 fVar13;
  floatx80 fVar14;
  floatx80 fVar15;
  floatx80 fVar16;
  floatx80 fVar17;
  floatx80 b;
  floatx80 b_00;
  floatx80 b_01;
  floatx80 b_02;
  floatx80 b_03;
  floatx80 b_04;
  floatx80 b_05;
  floatx80 b_06;
  floatx80 b_07;
  floatx80 b_08;
  floatx80 b_09;
  floatx80 b_10;
  floatx80 b_11;
  floatx80 b_12;
  floatx80 b_13;
  floatx80 b_14;
  floatx80 b_15;
  floatx80 b_16;
  floatx80 b_17;
  floatx80 b_18;
  floatx80 b_19;
  floatx80 b_20;
  
  auVar4 = a._0_12_;
  if ((~a._8_4_ & 0x7fff) == 0) {
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) {
      a_01._12_4_ = 0;
      a_01.low = auVar4._0_8_;
      a_01.high = auVar4._8_2_;
      a_01._10_2_ = auVar4._10_2_;
      fVar13 = propagateFloatx80NaNOneArg(a_01,status);
      return fVar13;
    }
    if ((short)a.high < 0) {
      uVar8 = 0;
      uVar10 = 0;
    }
    else {
      uVar10 = 0x7fff;
      uVar8 = 0;
    }
  }
  else if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 && a.low == 0)
  {
    uVar10 = CONCAT62((int6)((ulong)status >> 0x10),0x3fff);
    uVar8 = 0x8000000000000000;
  }
  else {
    cVar1 = status->float_rounding_mode;
    roundingPrecision = status->floatx80_rounding_precision;
    status->float_rounding_mode = '\0';
    status->floatx80_rounding_precision = 'P';
    uVar11 = (a._8_4_ & 0x7fff) * 0x10000;
    if (uVar11 + a.low._6_2_ + 0xbff464f8 < 0xffade4f8) {
      status->float_rounding_mode = cVar1;
      status->floatx80_rounding_precision = roundingPrecision;
      if (0x3fff8000 < (uVar11 | a.low._6_2_)) {
        if ((short)a.high < 0) {
          zExp = -0x1000;
        }
        else {
          zExp = 0x8000;
        }
        fVar13 = roundAndPackFloatx80_m68k(roundingPrecision,'\0',zExp,a.low,0,status);
        return fVar13;
      }
      fVar13 = float32_to_floatx80_m68k(0x3f800000,status);
      b_20._8_8_ = fVar13._8_8_ & 0xffffffff;
      a_22._12_4_ = 0;
      a_22.low = auVar4._0_8_;
      a_22.high = auVar4._8_2_;
      a_22._10_2_ = auVar4._10_2_;
      b_20.low = fVar13.low;
      fVar13 = floatx80_add_m68k(a_22,b_20,status);
      auVar4 = fVar13._0_12_;
    }
    else {
      fVar14 = float64_to_floatx80_m68k(0x406a934f0979a371,status);
      fVar15._8_8_ = fVar14._8_8_ & 0xffffffff;
      fVar13._12_4_ = 0;
      fVar13.low = auVar4._0_8_;
      fVar13.high = auVar4._8_2_;
      fVar13._10_2_ = auVar4._10_2_;
      fVar15.low = fVar14.low;
      fVar13 = floatx80_mul_m68k(fVar13,fVar15,status);
      auVar3 = fVar13._0_12_;
      fVar14._12_4_ = 0;
      fVar14.low = auVar3._0_8_;
      fVar14.high = auVar3._8_2_;
      fVar14._10_2_ = auVar3._10_2_;
      a_00 = floatx80_to_int32_m68k(fVar14,status);
      fVar13 = int32_to_floatx80_m68k(a_00,status);
      uVar7 = a_00 & 0x3f;
      uVar11 = a_00 + 0x3f;
      if ((int)a_00 >= 0) {
        uVar11 = a_00;
      }
      iVar12 = ((int)uVar11 >> 6) - (uint)(uVar7 != 0 && (int)a_00 < 0);
      iVar9 = iVar12 >> 1;
      uVar11 = exp2_tbl2[uVar7];
      uVar2 = *(undefined8 *)((long)&exp2_tbl[0].low + (ulong)(uVar7 << 4));
      sVar6 = *(short *)((long)&exp2_tbl[0].high + (ulong)(uVar7 << 4)) + (short)iVar9;
      fVar14 = float64_to_floatx80_m68k(0x3f734413509f8000,status);
      b._8_8_ = fVar14._8_8_ & 0xffffffff;
      auVar3 = fVar13._0_12_;
      fVar16._12_4_ = 0;
      fVar16.low = auVar3._0_8_;
      fVar16.high = auVar3._8_2_;
      fVar16._10_2_ = auVar3._10_2_;
      b.low = fVar14.low;
      fVar13 = floatx80_mul_m68k(fVar16,b,status);
      a_02._12_4_ = 0;
      a_02.low = auVar3._0_8_;
      a_02.high = auVar3._8_2_;
      a_02._10_2_ = auVar3._10_2_;
      b_00._8_8_ = 0xbfcd;
      b_00.low = 0xc0219dc1da994fd2;
      fVar14 = floatx80_mul_m68k(a_02,b_00,status);
      a_03._12_4_ = 0;
      a_03.low = auVar4._0_8_;
      a_03.high = auVar4._8_2_;
      a_03._10_2_ = auVar4._10_2_;
      auVar4 = fVar13._0_12_;
      b_01._12_4_ = 0;
      b_01.low = auVar4._0_8_;
      b_01.high = auVar4._8_2_;
      b_01._10_2_ = auVar4._10_2_;
      fVar13 = floatx80_sub_m68k(a_03,b_01,status);
      auVar4 = fVar13._0_12_;
      a_04._12_4_ = 0;
      a_04.low = auVar4._0_8_;
      a_04.high = auVar4._8_2_;
      a_04._10_2_ = auVar4._10_2_;
      auVar4 = fVar14._0_12_;
      b_02._12_4_ = 0;
      b_02.low = auVar4._0_8_;
      b_02.high = auVar4._8_2_;
      b_02._10_2_ = auVar4._10_2_;
      fVar13 = floatx80_sub_m68k(a_04,b_02,status);
      auVar4 = fVar13._0_12_;
      a_05._12_4_ = 0;
      a_05.low = auVar4._0_8_;
      a_05.high = auVar4._8_2_;
      a_05._10_2_ = auVar4._10_2_;
      b_03._8_8_ = 0x4000;
      b_03.low = 0x935d8dddaaa8ac17;
      fVar13 = floatx80_mul_m68k(a_05,b_03,status);
      b_04._8_8_ = fVar13._8_8_ & 0xffffffff;
      a_06._8_8_ = fVar13._8_8_ & 0xffffffff;
      a_06.low = fVar13.low;
      b_04.low = fVar13.low;
      fVar14 = floatx80_mul_m68k(a_06,b_04,status);
      fVar15 = float64_to_floatx80_m68k(0x3f56c16d6f7bd0b2,status);
      fVar16 = float64_to_floatx80_m68k(0x3f811112302c712c,status);
      auVar4 = fVar15._0_12_;
      a_07._12_4_ = 0;
      a_07.low = auVar4._0_8_;
      a_07.high = auVar4._8_2_;
      a_07._10_2_ = auVar4._10_2_;
      auVar4 = fVar14._0_12_;
      b_05._12_4_ = 0;
      b_05.low = auVar4._0_8_;
      b_05.high = auVar4._8_2_;
      b_05._10_2_ = auVar4._10_2_;
      fVar14 = floatx80_mul_m68k(a_07,b_05,status);
      auVar3 = fVar16._0_12_;
      a_08._12_4_ = 0;
      a_08.low = auVar3._0_8_;
      a_08.high = auVar3._8_2_;
      a_08._10_2_ = auVar3._10_2_;
      b_06._12_4_ = 0;
      b_06.low = auVar4._0_8_;
      b_06.high = auVar4._8_2_;
      b_06._10_2_ = auVar4._10_2_;
      fVar15 = floatx80_mul_m68k(a_08,b_06,status);
      fVar16 = float64_to_floatx80_m68k(0x3fa5555555554cc1,status);
      b_07._8_8_ = fVar16._8_8_ & 0xffffffff;
      auVar3 = fVar14._0_12_;
      a_09._12_4_ = 0;
      a_09.low = auVar3._0_8_;
      a_09.high = auVar3._8_2_;
      a_09._10_2_ = auVar3._10_2_;
      b_07.low = fVar16.low;
      fVar14 = floatx80_add_m68k(a_09,b_07,status);
      fVar16 = float64_to_floatx80_m68k(0x3fc5555555554a54,status);
      b_08._8_8_ = fVar16._8_8_ & 0xffffffff;
      auVar3 = fVar15._0_12_;
      a_10._12_4_ = 0;
      a_10.low = auVar3._0_8_;
      a_10.high = auVar3._8_2_;
      a_10._10_2_ = auVar3._10_2_;
      b_08.low = fVar16.low;
      fVar15 = floatx80_add_m68k(a_10,b_08,status);
      auVar3 = fVar14._0_12_;
      a_11._12_4_ = 0;
      a_11.low = auVar3._0_8_;
      a_11.high = auVar3._8_2_;
      a_11._10_2_ = auVar3._10_2_;
      b_09._12_4_ = 0;
      b_09.low = auVar4._0_8_;
      b_09.high = auVar4._8_2_;
      b_09._10_2_ = auVar4._10_2_;
      fVar14 = floatx80_mul_m68k(a_11,b_09,status);
      auVar3 = fVar15._0_12_;
      a_12._12_4_ = 0;
      a_12.low = auVar3._0_8_;
      a_12.high = auVar3._8_2_;
      a_12._10_2_ = auVar3._10_2_;
      b_10._12_4_ = 0;
      b_10.low = auVar4._0_8_;
      b_10.high = auVar4._8_2_;
      b_10._10_2_ = auVar4._10_2_;
      fVar15 = floatx80_mul_m68k(a_12,b_10,status);
      fVar16 = float64_to_floatx80_m68k(0x3fe0000000000000,status);
      b_11._8_8_ = fVar16._8_8_ & 0xffffffff;
      auVar3 = fVar14._0_12_;
      a_13._12_4_ = 0;
      a_13.low = auVar3._0_8_;
      a_13.high = auVar3._8_2_;
      a_13._10_2_ = auVar3._10_2_;
      b_11.low = fVar16.low;
      fVar14 = floatx80_add_m68k(a_13,b_11,status);
      auVar3 = fVar15._0_12_;
      a_14._12_4_ = 0;
      a_14.low = auVar3._0_8_;
      a_14.high = auVar3._8_2_;
      a_14._10_2_ = auVar3._10_2_;
      auVar3 = fVar13._0_12_;
      b_12._12_4_ = 0;
      b_12.low = auVar3._0_8_;
      b_12.high = auVar3._8_2_;
      b_12._10_2_ = auVar3._10_2_;
      fVar13 = floatx80_mul_m68k(a_14,b_12,status);
      auVar5 = fVar14._0_12_;
      a_15._12_4_ = 0;
      a_15.low = auVar5._0_8_;
      a_15.high = auVar5._8_2_;
      a_15._10_2_ = auVar5._10_2_;
      b_13._12_4_ = 0;
      b_13.low = auVar4._0_8_;
      b_13.high = auVar4._8_2_;
      b_13._10_2_ = auVar4._10_2_;
      fVar14 = floatx80_mul_m68k(a_15,b_13,status);
      a_16._12_4_ = 0;
      a_16.low = auVar3._0_8_;
      a_16.high = auVar3._8_2_;
      a_16._10_2_ = auVar3._10_2_;
      auVar4 = fVar13._0_12_;
      b_14._12_4_ = 0;
      b_14.low = auVar4._0_8_;
      b_14.high = auVar4._8_2_;
      b_14._10_2_ = auVar4._10_2_;
      fVar13 = floatx80_add_m68k(a_16,b_14,status);
      auVar4 = fVar13._0_12_;
      a_17._12_4_ = 0;
      a_17.low = auVar4._0_8_;
      a_17.high = auVar4._8_2_;
      a_17._10_2_ = auVar4._10_2_;
      auVar4 = fVar14._0_12_;
      b_15._12_4_ = 0;
      b_15.low = auVar4._0_8_;
      b_15.high = auVar4._8_2_;
      b_15._10_2_ = auVar4._10_2_;
      fVar13 = floatx80_add_m68k(a_17,b_15,status);
      auVar4 = fVar13._0_12_;
      a_18._12_4_ = 0;
      a_18.low = auVar4._0_8_;
      a_18.high = auVar4._8_2_;
      a_18._10_2_ = auVar4._10_2_;
      b_16.high = sVar6;
      b_16.low = uVar2;
      b_16._10_6_ = 0;
      fVar13 = floatx80_mul_m68k(a_18,b_16,status);
      auVar4 = fVar13._0_12_;
      a_19._12_4_ = 0;
      a_19.low = auVar4._0_8_;
      a_19.high = auVar4._8_2_;
      a_19._10_2_ = auVar4._10_2_;
      b_17._8_4_ = (uVar11 >> 0x10) + iVar9;
      b_17.low = (ulong)uVar11 << 0x30;
      b_17._12_4_ = 0;
      fVar13 = floatx80_add_m68k(a_19,b_17,status);
      auVar4 = fVar13._0_12_;
      a_20._12_4_ = 0;
      a_20.low = auVar4._0_8_;
      a_20.high = auVar4._8_2_;
      a_20._10_2_ = auVar4._10_2_;
      b_18.high = sVar6;
      b_18.low = uVar2;
      b_18._10_6_ = 0;
      fVar13 = floatx80_add_m68k(a_20,b_18,status);
      status->float_rounding_mode = cVar1;
      status->floatx80_rounding_precision = roundingPrecision;
      auVar4 = fVar13._0_12_;
      a_21._12_4_ = 0;
      a_21.low = auVar4._0_8_;
      a_21.high = auVar4._8_2_;
      a_21._10_2_ = auVar4._10_2_;
      b_19._8_4_ = (iVar12 - iVar9) + 0x3fff;
      b_19.low = 0x8000000000000000;
      b_19._12_4_ = 0;
      fVar13 = floatx80_mul_m68k(a_21,b_19,status);
      auVar4 = fVar13._0_12_;
    }
    uVar8 = auVar4._0_8_;
    float_raise_m68k(' ',status);
    uVar10 = (ulong)auVar4._8_4_;
  }
  fVar17._8_8_ = uVar10;
  fVar17.low = uVar8;
  return fVar17;
}

Assistant:

floatx80 floatx80_tentox(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig;

    int8_t user_rnd_mode, user_rnd_prec;

    int32_t compact, n, j, l, m, m1;
    floatx80 fp0, fp1, fp2, fp3, adjfact, fact1, fact2;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);

    if (aExp == 0x7FFF) {
        if ((uint64_t) (aSig << 1)) {
            return propagateFloatx80NaNOneArg(a, status);
        }
        if (aSign) {
            return packFloatx80(0, 0, 0);
        }
        return packFloatx80(0, floatx80_infinity.high,
                            floatx80_infinity.low);
    }

    if (aExp == 0 && aSig == 0) {
        return packFloatx80(0, one_exp, one_sig);
    }

    user_rnd_mode = status->float_rounding_mode;
    user_rnd_prec = status->floatx80_rounding_precision;
    status->float_rounding_mode = float_round_nearest_even;
    status->floatx80_rounding_precision = 80;

    fp0 = a;

    compact = floatx80_make_compact(aExp, aSig);

    if (compact < 0x3FB98000 || compact > 0x400B9B07) {
        /* |X| > 16480 LOG2/LOG10 or |X| < 2^(-70) */
        if (compact > 0x3FFF8000) { /* |X| > 16480 */
            status->float_rounding_mode = user_rnd_mode;
            status->floatx80_rounding_precision = user_rnd_prec;

            if (aSign) {
                return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                            0, -0x1000, aSig, 0, status);
            } else {
                return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                            0, 0x8000, aSig, 0, status);
            }
        } else { /* |X| < 2^(-70) */
            status->float_rounding_mode = user_rnd_mode;
            status->floatx80_rounding_precision = user_rnd_prec;

            a = floatx80_add(fp0, float32_to_floatx80(
                             make_float32(0x3F800000), status),
                             status); /* 1 + X */

            float_raise(float_flag_inexact, status);

            return a;
        }
    } else { /* 2^(-70) <= |X| <= 16480 LOG 2 / LOG 10 */
        fp1 = fp0; /* X */
        fp1 = floatx80_mul(fp1, float64_to_floatx80(
                           make_float64(0x406A934F0979A371),
                           status), status); /* X*64*LOG10/LOG2 */
        n = floatx80_to_int32(fp1, status); /* N=INT(X*64*LOG10/LOG2) */
        fp1 = int32_to_floatx80(n, status);

        j = n & 0x3F;
        l = n / 64; /* NOTE: this is really arithmetic right shift by 6 */
        if (n < 0 && j) {
            /*
             * arithmetic right shift is division and
             * round towards minus infinity
             */
            l--;
        }
        m = l / 2; /* NOTE: this is really arithmetic right shift by 1 */
        if (l < 0 && (l & 1)) {
            /*
             * arithmetic right shift is division and
             * round towards minus infinity
             */
            m--;
        }
        m1 = l - m;
        m1 += 0x3FFF; /* ADJFACT IS 2^(M') */

        adjfact = packFloatx80(0, m1, one_sig);
        fact1 = exp2_tbl[j];
        fact1.high += m;
        fact2.high = exp2_tbl2[j] >> 16;
        fact2.high += m;
        fact2.low = (uint64_t)(exp2_tbl2[j] & 0xFFFF);
        fact2.low <<= 48;

        fp2 = fp1; /* N */
        fp1 = floatx80_mul(fp1, float64_to_floatx80(
                           make_float64(0x3F734413509F8000), status),
                           status); /* N*(LOG2/64LOG10)_LEAD */
        fp3 = packFloatx80(1, 0x3FCD, UINT64_C(0xC0219DC1DA994FD2));
        fp2 = floatx80_mul(fp2, fp3, status); /* N*(LOG2/64LOG10)_TRAIL */
        fp0 = floatx80_sub(fp0, fp1, status); /* X - N L_LEAD */
        fp0 = floatx80_sub(fp0, fp2, status); /* X - N L_TRAIL */
        fp2 = packFloatx80(0, 0x4000, UINT64_C(0x935D8DDDAAA8AC17)); /* LOG10 */
        fp0 = floatx80_mul(fp0, fp2, status); /* R */

        /* EXPR */
        fp1 = floatx80_mul(fp0, fp0, status); /* S = R*R */
        fp2 = float64_to_floatx80(make_float64(0x3F56C16D6F7BD0B2),
                                  status); /* A5 */
        fp3 = float64_to_floatx80(make_float64(0x3F811112302C712C),
                                  status); /* A4 */
        fp2 = floatx80_mul(fp2, fp1, status); /* S*A5 */
        fp3 = floatx80_mul(fp3, fp1, status); /* S*A4 */
        fp2 = floatx80_add(fp2, float64_to_floatx80(
                           make_float64(0x3FA5555555554CC1), status),
                           status); /* A3+S*A5 */
        fp3 = floatx80_add(fp3, float64_to_floatx80(
                           make_float64(0x3FC5555555554A54), status),
                           status); /* A2+S*A4 */
        fp2 = floatx80_mul(fp2, fp1, status); /* S*(A3+S*A5) */
        fp3 = floatx80_mul(fp3, fp1, status); /* S*(A2+S*A4) */
        fp2 = floatx80_add(fp2, float64_to_floatx80(
                           make_float64(0x3FE0000000000000), status),
                           status); /* A1+S*(A3+S*A5) */
        fp3 = floatx80_mul(fp3, fp0, status); /* R*S*(A2+S*A4) */

        fp2 = floatx80_mul(fp2, fp1, status); /* S*(A1+S*(A3+S*A5)) */
        fp0 = floatx80_add(fp0, fp3, status); /* R+R*S*(A2+S*A4) */
        fp0 = floatx80_add(fp0, fp2, status); /* EXP(R) - 1 */

        fp0 = floatx80_mul(fp0, fact1, status);
        fp0 = floatx80_add(fp0, fact2, status);
        fp0 = floatx80_add(fp0, fact1, status);

        status->float_rounding_mode = user_rnd_mode;
        status->floatx80_rounding_precision = user_rnd_prec;

        a = floatx80_mul(fp0, adjfact, status);

        float_raise(float_flag_inexact, status);

        return a;
    }
}